

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_7246::test_art_iterator_lower_bound(void **param_1)

{
  initializer_list<const_char_*> __l;
  initializer_list<(anonymous_namespace)::Value> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<(anonymous_namespace)::Value> __l_02;
  initializer_list<const_char_*> __l_03;
  initializer_list<(anonymous_namespace)::Value> __l_04;
  ulong uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  size_type sVar10;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> *pvVar11;
  reference ppcVar12;
  art_iterator_t *paVar13;
  char *key3;
  char *key2_1;
  art_iterator_t iterator_3;
  art_t art_3;
  Value value;
  char *key1_1;
  char *key_4;
  char *key_3;
  char *key_2;
  char *key_1;
  art_iterator_t iterator_2;
  size_t i_2;
  art_t art_2;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values_2;
  vector<const_char_*,_std::allocator<const_char_*>_> keys_2;
  char *key2;
  char *key1;
  art_iterator_t iterator_1;
  size_t i_1;
  art_t art_1;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values_1;
  vector<const_char_*,_std::allocator<const_char_*>_> keys_1;
  char *key;
  art_iterator_t iterator;
  size_t i;
  art_t art;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  undefined1 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa79;
  undefined1 in_stack_fffffffffffffa7a;
  undefined1 in_stack_fffffffffffffa7b;
  undefined1 in_stack_fffffffffffffa7c;
  undefined1 in_stack_fffffffffffffa7d;
  undefined1 in_stack_fffffffffffffa7e;
  undefined1 in_stack_fffffffffffffa7f;
  art_t *in_stack_fffffffffffffa80;
  art_iterator_t *in_stack_fffffffffffffa88;
  art_iterator_t *iterator_00;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
  *in_stack_fffffffffffffa90;
  allocator_type *in_stack_fffffffffffffaa8;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
  *in_stack_fffffffffffffab0;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> *this;
  iterator in_stack_fffffffffffffab8;
  iterator pVVar14;
  size_type in_stack_fffffffffffffac0;
  undefined1 *puVar15;
  undefined1 local_478 [8];
  Value local_470;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  art_iterator_t *local_3b0;
  undefined1 local_3a8 [15];
  undefined1 local_399 [17];
  Value local_388;
  Value local_378;
  undefined1 *local_368;
  undefined8 local_360;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_358;
  char *local_338;
  char *pcStack_330;
  char *local_328;
  char **local_320;
  undefined8 local_318;
  vector<const_char_*,_std::allocator<const_char_*>_> local_310;
  char *local_2f8;
  char *local_2f0;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> *local_260;
  undefined1 local_258 [15];
  undefined1 local_249 [17];
  Value local_238;
  Value local_228;
  Value local_218;
  undefined1 *local_208;
  undefined8 local_200;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_1f8;
  undefined1 local_1d9;
  char *local_1d8;
  char *pcStack_1d0;
  char *local_1c8;
  char *pcStack_1c0;
  char **local_1b8;
  undefined8 local_1b0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1a8;
  char *local_190;
  ulong local_100;
  undefined1 local_f8 [16];
  Value local_e8;
  Value local_d8;
  Value local_c8;
  Value local_b8;
  Value local_a8;
  Value *local_98;
  undefined8 local_90;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_88 [2];
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char **local_30;
  undefined8 local_28;
  vector<const_char_*,_std::allocator<const_char_*>_> local_20;
  
  local_38 = "001005";
  local_48 = "000003";
  pcStack_40 = "000004";
  local_58 = "000001";
  pcStack_50 = "000002";
  local_30 = &local_58;
  local_28 = 5;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x10400a);
  __l._M_len = in_stack_fffffffffffffac0;
  __l._M_array = (iterator)in_stack_fffffffffffffab8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffab0,__l,
             (allocator_type *)in_stack_fffffffffffffaa8);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x10403b);
  Value::Value(&local_e8,1);
  Value::Value(&local_d8,2);
  Value::Value(&local_c8,3);
  Value::Value(&local_b8,4);
  Value::Value(&local_a8,5);
  local_98 = &local_e8;
  local_90 = 5;
  std::allocator<(anonymous_namespace)::Value>::allocator
            ((allocator<(anonymous_namespace)::Value> *)0x1040cd);
  __l_00._M_len = in_stack_fffffffffffffac0;
  __l_00._M_array = in_stack_fffffffffffffab8;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (in_stack_fffffffffffffab0,__l_00,in_stack_fffffffffffffaa8);
  std::allocator<(anonymous_namespace)::Value>::~allocator
            ((allocator<(anonymous_namespace)::Value> *)0x1040fe);
  memset(local_f8,0,8);
  local_100 = 0;
  while( true ) {
    uVar1 = local_100;
    sVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_20);
    if (sVar10 <= uVar1) break;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,local_100);
    std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
    operator[](local_88,local_100);
    art_insert((art_t *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88->key,
               (art_val_t *)in_stack_fffffffffffffa80);
    assert_art_valid(in_stack_fffffffffffffa80);
    local_100 = local_100 + 1;
  }
  art_init_iterator((art_t *)in_stack_fffffffffffffa90,
                    SUB81((ulong)in_stack_fffffffffffffa88 >> 0x38,0));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,2);
  art_iterator_lower_bound(in_stack_fffffffffffffa88,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,
               (char *)in_stack_fffffffffffffa80,
               CONCAT13(in_stack_fffffffffffffa7f,
                        CONCAT12(in_stack_fffffffffffffa7e,
                                 CONCAT11(in_stack_fffffffffffffa7d,in_stack_fffffffffffffa7c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,2);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(in_stack_fffffffffffffa7f,
                         CONCAT16(in_stack_fffffffffffffa7e,
                                  CONCAT15(in_stack_fffffffffffffa7d,
                                           CONCAT14(in_stack_fffffffffffffa7c,
                                                    CONCAT13(in_stack_fffffffffffffa7b,
                                                             CONCAT12(in_stack_fffffffffffffa7a,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffffa79,
                                                  in_stack_fffffffffffffa78))))))));
  local_190 = "000005";
  art_iterator_lower_bound(in_stack_fffffffffffffa88,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,
               (char *)in_stack_fffffffffffffa80,
               CONCAT13(in_stack_fffffffffffffa7f,
                        CONCAT12(in_stack_fffffffffffffa7e,
                                 CONCAT11(in_stack_fffffffffffffa7d,in_stack_fffffffffffffa7c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_20,4);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(in_stack_fffffffffffffa7f,
                         CONCAT16(in_stack_fffffffffffffa7e,
                                  CONCAT15(in_stack_fffffffffffffa7d,
                                           CONCAT14(in_stack_fffffffffffffa7c,
                                                    CONCAT13(in_stack_fffffffffffffa7b,
                                                             CONCAT12(in_stack_fffffffffffffa7a,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffffa79,
                                                  in_stack_fffffffffffffa78))))))));
  art_free((art_t *)0x104356);
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::~vector
            (in_stack_fffffffffffffa90);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffa90);
  local_1c8 = "000004";
  pcStack_1c0 = "001005";
  local_1d8 = "000001";
  pcStack_1d0 = "000003";
  local_1b8 = &local_1d8;
  local_1b0 = 4;
  puVar15 = &local_1d9;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x1043be);
  __l_01._M_len = (size_type)puVar15;
  __l_01._M_array = (iterator)in_stack_fffffffffffffab8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffab0,__l_01
             ,(allocator_type *)in_stack_fffffffffffffaa8);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x1043ef);
  Value::Value((Value *)(local_249 + 1),1);
  Value::Value(&local_238,3);
  Value::Value(&local_228,4);
  Value::Value(&local_218,5);
  local_208 = local_249 + 1;
  local_200 = 4;
  pVVar14 = (iterator)local_249;
  std::allocator<(anonymous_namespace)::Value>::allocator
            ((allocator<(anonymous_namespace)::Value> *)0x10446d);
  __l_02._M_len = (size_type)puVar15;
  __l_02._M_array = pVVar14;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (in_stack_fffffffffffffab0,__l_02,in_stack_fffffffffffffaa8);
  std::allocator<(anonymous_namespace)::Value>::~allocator
            ((allocator<(anonymous_namespace)::Value> *)0x10449e);
  memset(local_258,0,8);
  local_260 = (vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> *
              )0x0;
  while( true ) {
    this = local_260;
    pvVar11 = (vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> *
              )std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_1a8);
    if (pvVar11 <= this) break;
    ppcVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         (&local_1a8,(size_type)local_260);
    in_stack_fffffffffffffaa8 = (allocator_type *)*ppcVar12;
    std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
    operator[](&local_1f8,(size_type)local_260);
    art_insert((art_t *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88->key,
               (art_val_t *)in_stack_fffffffffffffa80);
    assert_art_valid(in_stack_fffffffffffffa80);
    local_260 = (vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                 *)((long)&(local_260->
                           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  art_init_iterator((art_t *)in_stack_fffffffffffffa90,
                    SUB81((ulong)in_stack_fffffffffffffa88 >> 0x38,0));
  local_2f0 = "000002";
  art_iterator_lower_bound(in_stack_fffffffffffffa88,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,
               (char *)in_stack_fffffffffffffa80,
               CONCAT13(in_stack_fffffffffffffa7f,
                        CONCAT12(in_stack_fffffffffffffa7e,
                                 CONCAT11(in_stack_fffffffffffffa7d,in_stack_fffffffffffffa7c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_1a8,1);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(in_stack_fffffffffffffa7f,
                         CONCAT16(in_stack_fffffffffffffa7e,
                                  CONCAT15(in_stack_fffffffffffffa7d,
                                           CONCAT14(in_stack_fffffffffffffa7c,
                                                    CONCAT13(in_stack_fffffffffffffa7b,
                                                             CONCAT12(in_stack_fffffffffffffa7a,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffffa79,
                                                  in_stack_fffffffffffffa78))))))));
  local_2f8 = "000001";
  art_iterator_lower_bound(in_stack_fffffffffffffa88,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,
               (char *)in_stack_fffffffffffffa80,
               CONCAT13(in_stack_fffffffffffffa7f,
                        CONCAT12(in_stack_fffffffffffffa7e,
                                 CONCAT11(in_stack_fffffffffffffa7d,in_stack_fffffffffffffa7c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_1a8,0);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(in_stack_fffffffffffffa7f,
                         CONCAT16(in_stack_fffffffffffffa7e,
                                  CONCAT15(in_stack_fffffffffffffa7d,
                                           CONCAT14(in_stack_fffffffffffffa7c,
                                                    CONCAT13(in_stack_fffffffffffffa7b,
                                                             CONCAT12(in_stack_fffffffffffffa7a,
                                                                      CONCAT11(
                                                  in_stack_fffffffffffffa79,
                                                  in_stack_fffffffffffffa78))))))));
  art_free((art_t *)0x104709);
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::~vector
            (in_stack_fffffffffffffa90);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffa90);
  local_328 = "000300";
  local_338 = "000100";
  pcStack_330 = "000200";
  local_320 = &local_338;
  local_318 = 3;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x104771);
  __l_03._M_len = (size_type)puVar15;
  __l_03._M_array = (iterator)pVVar14;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)this,__l_03,
             (allocator_type *)in_stack_fffffffffffffaa8);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x1047a2);
  Value::Value((Value *)(local_399 + 1),1);
  Value::Value(&local_388,2);
  Value::Value(&local_378,3);
  local_368 = local_399 + 1;
  local_360 = 3;
  pvVar11 = (vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> *)
            local_399;
  std::allocator<(anonymous_namespace)::Value>::allocator
            ((allocator<(anonymous_namespace)::Value> *)0x10480c);
  __l_04._M_len = (size_type)puVar15;
  __l_04._M_array = pVVar14;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (this,__l_04,in_stack_fffffffffffffaa8);
  std::allocator<(anonymous_namespace)::Value>::~allocator
            ((allocator<(anonymous_namespace)::Value> *)0x10483d);
  memset(local_3a8,0,8);
  local_3b0 = (art_iterator_t *)0x0;
  while( true ) {
    iterator_00 = local_3b0;
    paVar13 = (art_iterator_t *)
              std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_310);
    if (paVar13 <= iterator_00) break;
    ppcVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         (&local_310,(size_type)local_3b0);
    in_stack_fffffffffffffa80 = (art_t *)*ppcVar12;
    std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
    operator[](&local_358,(size_type)local_3b0);
    art_insert((art_t *)pvVar11,iterator_00->key,(art_val_t *)in_stack_fffffffffffffa80);
    assert_art_valid(in_stack_fffffffffffffa80);
    local_3b0 = (art_iterator_t *)(local_3b0->key + 1);
  }
  art_init_iterator((art_t *)pvVar11,SUB81((ulong)iterator_00 >> 0x38,0));
  local_440 = "000201";
  uVar2 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(in_stack_fffffffffffffa7e,
                                       CONCAT11(in_stack_fffffffffffffa7d,in_stack_fffffffffffffa7c)
                                      )));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_310,2);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa7e,
                                        CONCAT15(in_stack_fffffffffffffa7d,
                                                 CONCAT14(in_stack_fffffffffffffa7c,
                                                          CONCAT13(in_stack_fffffffffffffa7b,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  CONCAT11(in_stack_fffffffffffffa79,
                                                           in_stack_fffffffffffffa78))))))));
  local_448 = "000099";
  uVar3 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(in_stack_fffffffffffffa7d,
                                                      in_stack_fffffffffffffa7c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_310,0);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffa7d,
                                                       CONCAT14(in_stack_fffffffffffffa7c,
                                                                CONCAT13(in_stack_fffffffffffffa7b,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  CONCAT11(in_stack_fffffffffffffa79,
                                                           in_stack_fffffffffffffa78))))))));
  local_450 = "000300";
  uVar4 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,in_stack_fffffffffffffa7c))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_310,2);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffa7c,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffa7b,
                                                  CONCAT12(in_stack_fffffffffffffa7a,
                                                           CONCAT11(in_stack_fffffffffffffa79,
                                                                    in_stack_fffffffffffffa78)))))))
               );
  uVar5 = art_iterator_next((art_iterator_t *)0x104b1c);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  uVar6 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_310,2);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  in_stack_fffffffffffffa7a,
                                                  CONCAT11(in_stack_fffffffffffffa79,
                                                           in_stack_fffffffffffffa78))))))));
  local_458 = "000100";
  uVar7 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_310,0);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(in_stack_fffffffffffffa79,
                                                                 in_stack_fffffffffffffa78))))))));
  uVar8 = art_iterator_prev((art_iterator_t *)0x104c2f);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  uVar9 = art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&local_310,0);
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  art_free((art_t *)0x104ccc);
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::~vector
            (pvVar11);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)pvVar11);
  local_460 = "000001";
  Value::Value(&local_470,1);
  memset(local_478,0,8);
  art_insert((art_t *)pvVar11,iterator_00->key,(art_val_t *)in_stack_fffffffffffffa80);
  art_init_iterator((art_t *)pvVar11,SUB81((ulong)iterator_00 >> 0x38,0));
  art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  assert_key_eq((art_key_chunk_t *)in_stack_fffffffffffffa80,
                (art_key_chunk_t *)
                CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  art_iterator_lower_bound(iterator_00,(art_key_chunk_t *)in_stack_fffffffffffffa80);
  _assert_true((unsigned_long)pvVar11,(char *)iterator_00,(char *)in_stack_fffffffffffffa80,
               CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  art_free((art_t *)0x104e41);
  return;
}

Assistant:

DEFINE_TEST(test_art_iterator_lower_bound) {
    {
        std::vector<const char*> keys = {
            "000001", "000002", "000003", "000004", "001005",
        };
        std::vector<Value> values = {{1}, {2}, {3}, {4}, {5}};
        art_t art{NULL};
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
            assert_art_valid(&art);
        }

        art_iterator_t iterator = art_init_iterator(&art, true);
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2]));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        const char* key = "000005";
        assert_true(art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[4]);
        art_free(&art);
    }
    {
        // Lower bound search within a node's children.
        std::vector<const char*> keys = {"000001", "000003", "000004",
                                         "001005"};
        std::vector<Value> values = {{1}, {3}, {4}, {5}};
        art_t art{NULL};
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        const char* key1 = "000002";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[1]);

        // Check that we can go backward within a node's children.
        const char* key2 = "000001";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);

        art_free(&art);
    }
    {
        // Lower bound search with leaf where prefix is equal but full key is
        // smaller.
        std::vector<const char*> keys = {"000100", "000200", "000300"};
        std::vector<Value> values = {{1}, {2}, {3}};
        art_t art{NULL};
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        {
            const char* key = "000201";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go backward.
            const char* key = "000099";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }
        {
            // Check that we can go backward from after the end.
            const char* key = "000300";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
            assert_false(art_iterator_next(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go forward from before the start.
            const char* key = "000100";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
            assert_false(art_iterator_prev(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }

        art_free(&art);
    }
    {
        // Lower bound search with only a single leaf.
        const char* key1 = "000001";
        Value value{1};
        art_t art{NULL};
        art_insert(&art, (art_key_chunk_t*)key1, &value);

        art_iterator_t iterator = art_init_iterator(&art, true);

        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key2 = "000000";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key3 = "000002";
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3));

        art_free(&art);
    }
}